

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O0

void __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
::slowPathFree(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
               *this,int binIndex,uint u,uint a)

{
  uint uVar1;
  uint uVar2;
  SuperblockType *pSVar3;
  Statistics *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
  *in_RDI;
  uint totalObjects;
  Statistics *stats;
  size_t sz;
  SuperblockType *sb;
  Check<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>,_Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>::sanityCheck>
  check;
  void *in_stack_ffffffffffffff88;
  Statistics *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar4;
  Check<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>,_Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>::sanityCheck>
  local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  Check<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>,_Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>::sanityCheck>
  ::Check(&local_15,in_RDI);
  Array<15UL,_Hoard::ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>_>
  ::operator()(&in_RDI->_otherBins,local_c);
  pSVar3 = ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
           ::get((ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
                  *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (pSVar3 != (SuperblockType *)0x0) {
    HL::bins<Hoard::HoardSuperblockHeader<HL::SpinLockType,_262144,_Hoard::SmallHeap>,_262144UL>::
    getClassSize(local_c);
    this_00 = Array<15UL,_Hoard::Statistics>::operator()(&in_RDI->_stats,local_c);
    uVar1 = HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
            ::getTotalObjects((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                               *)0x11c992);
    this_01 = this_00;
    uVar4 = uVar1;
    uVar2 = HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
            ::getObjectsFree((HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>
                              *)0x11c9c4);
    Statistics::setInUse(this_01,local_10 + (uVar2 - uVar4));
    Statistics::setAllocated(this_00,local_14 - uVar1);
    GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>::put
              ((GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>
                *)this_01,in_stack_ffffffffffffff88,0x11ca13);
  }
  Check<Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>,_Hoard::HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>::sanityCheck>
  ::~Check(&local_15);
  return;
}

Assistant:

NO_INLINE void slowPathFree (int binIndex, unsigned int u, unsigned int a) {
      // We've crossed the threshold.
      // Remove a superblock and give it to the 'parent heap.'
      Check<HoardManager, sanityCheck> check (this);
    
      //	printf ("HoardManager: this = %x, getting a superblock\n", this);
    
      SuperblockType * sb = _otherBins(binIndex).get ();
    
      // We should always get one.
      assert (sb);
      if (sb) {

	auto sz = binType::getClassSize (binIndex);
	auto& stats = _stats(binIndex);
	auto totalObjects = sb->getTotalObjects();
	stats.setInUse (u - (totalObjects - sb->getObjectsFree()));
	stats.setAllocated (a - totalObjects);

	// Give it to the parent heap.
	///////// NOTE: We change the superblock type here!
	///////// THIS HAD BETTER BE SAFE!
	_ph.put (reinterpret_cast<typename ParentHeap::SuperblockType *>(sb), sz);
	assert (sb->isValidSuperblock());

      }
    }